

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
::_reduce(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>
          *this)

{
  size_type *this_00;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  iterator __position;
  node_ptr plVar1;
  __node_base_ptr p_Var2;
  Zp_field_operators<unsigned_int,_void> *this_02;
  undefined1 *puVar3;
  pointer pPVar4;
  pointer pvVar5;
  int iVar6;
  mapped_type *pmVar7;
  Delete_disposer DVar8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  pointer pPVar12;
  float *pfVar13;
  uint uVar14;
  ulong uVar15;
  Column_support *this_03;
  float fVar16;
  __node_base_ptr p_Var17;
  long lVar18;
  float fVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  pointer this_04;
  Element coef;
  Index i;
  int dim;
  Index pivotColumnNumber;
  Pos_index nullDeath;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columnsByDim;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  negativeColumns;
  float local_c4;
  float local_c0;
  int local_bc;
  float local_b8;
  uint local_b4;
  vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
  *local_b0;
  Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
  *local_a8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  float *local_78;
  float *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_b4 = 0xffffffff;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,
               (ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor,
               (hash<unsigned_int> *)&local_a0,(key_equal *)&local_c4,(allocator_type *)&local_bc);
  local_bc = *(int *)&this[-1].barcode_.
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_a0,(long)local_bc + 1,(allocator_type *)&local_c4);
  pvVar5 = local_a0.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_04 = local_a0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_04 != pvVar5; this_04 = this_04 + 1
      ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_04,(ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor
              );
  }
  local_c0 = 0.0;
  if (this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor != 0.0) {
    do {
      lVar18 = (long)local_bc;
      local_c4 = local_c0;
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this[1].super_type.map_._M_h._M_bucket_count,(key_type *)&local_c4);
      this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                (local_a0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                (lVar18 - (pmVar7->super_Column_dimension_option).dim_));
      __position._M_current = *(uint **)(this_01 + 8);
      if (__position._M_current == *(uint **)(this_01 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_01,__position,(uint *)&local_c0);
      }
      else {
        *__position._M_current = (uint)local_c0;
        *(uint **)(this_01 + 8) = __position._M_current + 1;
      }
      local_c0 = (float)((int)local_c0 + 1);
    } while ((uint)local_c0 < (uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor
            );
  }
  local_88 = local_a0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_a0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_a0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8 = (Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                *)&this[-1].deathToBar_;
    this_00 = &this[1].super_type.map_._M_h._M_bucket_count;
    local_b0 = (vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                *)&this->barcode_;
    do {
      pfVar13 = (float *)((local_a0.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
      local_78 = (float *)((local_a0.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
      local_80 = local_a0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (pfVar13 != local_78) {
        do {
          fVar16 = *pfVar13;
          local_c0 = fVar16;
          local_70 = pfVar13;
          if (this[-1].isReduced_ == true) {
            Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
            ::_orderRows(local_a8);
          }
          local_c4 = fVar16;
          DVar8.col_ = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_c4);
          this_03 = &(DVar8.col_)->column_;
          plVar1 = ((DVar8.col_)->column_).super_type.data_.root_plus_size_.m_header.super_node.
                   next_;
          if (plVar1 == (node_ptr)0x0 || plVar1 == (node_ptr)this_03) {
            p_Var2 = local_68._M_buckets[(ulong)(uint)local_c0 % local_68._M_bucket_count];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var2, p_Var17 = p_Var2->_M_nxt,
               local_c0 != *(float *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var9 = p_Var17->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)(uint)*(float *)&p_Var9[1]._M_nxt % local_68._M_bucket_count !=
                     (ulong)(uint)local_c0 % local_68._M_bucket_count) ||
                   (p_Var10 = p_Var17, p_Var17 = p_Var9, local_c0 == *(float *)&p_Var9[1]._M_nxt))
                goto LAB_00173bb2;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_00173bb2:
            if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                        (local_b0,(uint *)&local_c0,&local_b4,&local_bc);
            }
          }
          else {
            fVar16 = *(float *)&((DVar8.col_)->column_).super_type.data_.root_plus_size_.m_header.
                                super_node.prev_[1].next_;
            uVar11 = (this->idToPosition_)._M_h._M_bucket_count;
            uVar15 = (ulong)(uint)fVar16 % uVar11;
            p_Var2 = (this->idToPosition_)._M_h._M_buckets[uVar15];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var2, p_Var17 = p_Var2->_M_nxt,
               fVar16 != *(float *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var9 = p_Var17->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)(uint)*(float *)&p_Var9[1]._M_nxt % uVar11 != uVar15) ||
                   (p_Var10 = p_Var17, p_Var17 = p_Var9, fVar16 == *(float *)&p_Var9[1]._M_nxt))
                goto LAB_00173bdf;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_00173bdf:
            if (p_Var10 == (__node_base_ptr)0x0) {
              p_Var9 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var9 = p_Var10->_M_nxt;
            }
            local_b8 = fVar16;
            if (p_Var9 != (_Hash_node_base *)0x0) {
              local_b8 = *(float *)((long)&p_Var9[1]._M_nxt + 4);
            }
            p_Var2 = local_68._M_buckets[(ulong)(uint)local_b8 % local_68._M_bucket_count];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var2, p_Var17 = p_Var2->_M_nxt,
               local_b8 != *(float *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var9 = p_Var17->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)(uint)*(float *)&p_Var9[1]._M_nxt % local_68._M_bucket_count !=
                     (ulong)(uint)local_b8 % local_68._M_bucket_count) ||
                   (p_Var10 = p_Var17, p_Var17 = p_Var9, local_b8 == *(float *)&p_Var9[1]._M_nxt))
                goto LAB_00173c58;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_00173c58:
            if (p_Var10 == (__node_base_ptr)0x0) {
              p_Var9 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var9 = p_Var10->_M_nxt;
            }
            if (p_Var9 == (_Hash_node_base *)0x0) {
              fVar19 = -NAN;
            }
            else {
              fVar19 = *(float *)((long)&p_Var9[1]._M_nxt + 4);
            }
            while ((fVar16 != -NAN && (fVar19 != -NAN))) {
              if (this[-1].isReduced_ == true) {
                Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                ::_orderRows(local_a8);
              }
              local_c4 = fVar19;
              pmVar7 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_c4);
              plVar1 = (pmVar7->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
              uVar14 = 0;
              if (plVar1 != (node_ptr)&pmVar7->column_ && plVar1 != (node_ptr)0x0) {
                uVar14 = *(uint *)((long)&(pmVar7->column_).super_type.data_.root_plus_size_.
                                          m_header.super_node.prev_[-2].prev_ + 4);
              }
              this_02 = (Zp_field_operators<unsigned_int,_void> *)
                        this[1].barcode_.
                        super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if (this_02->characteristic_ <= uVar14) {
                uVar14 = uVar14 % this_02->characteristic_;
              }
              local_c4 = (float)(this_02->inverse_).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar14];
              puVar3 = (undefined1 *)
                       (this_03->super_type).data_.root_plus_size_.m_header.super_node.next_;
              iVar6 = 0;
              if ((Column_support *)puVar3 != this_03 && puVar3 != (undefined1 *)0x0) {
                iVar6 = *(int *)((long)&((DVar8.col_)->column_).super_type.data_.root_plus_size_.
                                        m_header.super_node.prev_[-2].prev_ + 4);
              }
              persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                        (this_02,(Element *)&local_c4,this_02->characteristic_ - iVar6);
              _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>>
                        ((Field_element *)&local_c4,pmVar7,DVar8.col_);
              puVar3 = (undefined1 *)
                       (this_03->super_type).data_.root_plus_size_.m_header.super_node.next_;
              fVar16 = -NAN;
              if ((Column_support *)puVar3 != this_03 && puVar3 != (undefined1 *)0x0) {
                fVar16 = *(float *)&((DVar8.col_)->column_).super_type.data_.root_plus_size_.
                                    m_header.super_node.prev_[1].next_;
              }
              uVar11 = (this->idToPosition_)._M_h._M_bucket_count;
              uVar15 = (ulong)(uint)fVar16 % uVar11;
              p_Var2 = (this->idToPosition_)._M_h._M_buckets[uVar15];
              p_Var10 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var10 = p_Var2, p_Var17 = p_Var2->_M_nxt,
                 fVar16 != *(float *)&p_Var2->_M_nxt[1]._M_nxt)) {
                while (p_Var9 = p_Var17->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                  p_Var10 = (__node_base_ptr)0x0;
                  if (((ulong)(uint)*(float *)&p_Var9[1]._M_nxt % uVar11 != uVar15) ||
                     (p_Var10 = p_Var17, p_Var17 = p_Var9, fVar16 == *(float *)&p_Var9[1]._M_nxt))
                  goto LAB_00173dac;
                }
                p_Var10 = (__node_base_ptr)0x0;
              }
LAB_00173dac:
              if (p_Var10 == (__node_base_ptr)0x0) {
                p_Var9 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var9 = p_Var10->_M_nxt;
              }
              local_b8 = fVar16;
              if (p_Var9 != (_Hash_node_base *)0x0) {
                local_b8 = *(float *)((long)&p_Var9[1]._M_nxt + 4);
              }
              p_Var2 = local_68._M_buckets[(ulong)(uint)local_b8 % local_68._M_bucket_count];
              p_Var10 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var10 = p_Var2, p_Var17 = p_Var2->_M_nxt,
                 local_b8 != *(float *)&p_Var2->_M_nxt[1]._M_nxt)) {
                while (p_Var9 = p_Var17->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                  p_Var10 = (__node_base_ptr)0x0;
                  if (((ulong)(uint)*(float *)&p_Var9[1]._M_nxt % local_68._M_bucket_count !=
                       (ulong)(uint)local_b8 % local_68._M_bucket_count) ||
                     (p_Var10 = p_Var17, p_Var17 = p_Var9, local_b8 == *(float *)&p_Var9[1]._M_nxt))
                  goto LAB_00173e25;
                }
                p_Var10 = (__node_base_ptr)0x0;
              }
LAB_00173e25:
              if (p_Var10 == (__node_base_ptr)0x0) {
                p_Var9 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var9 = p_Var10->_M_nxt;
              }
              if (p_Var9 == (_Hash_node_base *)0x0) {
                fVar19 = -NAN;
              }
              else {
                fVar19 = *(float *)((long)&p_Var9[1]._M_nxt + 4);
              }
            }
            if (fVar16 != -NAN) {
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_int&,unsigned_int&>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_68,&local_b8,&local_c0);
              fVar16 = local_b8;
              if (this[-1].isReduced_ == true) {
                Base_swap<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>
                ::_orderRows(local_a8);
              }
              local_c4 = fVar16;
              DVar8.col_ = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&local_c4);
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              ::
              clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>::Delete_disposer>
                        ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                          *)&(DVar8.col_)->column_,DVar8);
              local_c4 = (float)(local_bc - 1);
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int&,int>
                        (local_b0,(uint *)&local_b8,(uint *)&local_c0,(int *)&local_c4);
            }
            else {
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              ::
              clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>::Delete_disposer>
                        ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                          *)this_03,DVar8);
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                        (local_b0,(uint *)&local_c0,&local_b4,&local_bc);
            }
          }
          pfVar13 = local_70 + 1;
        } while (pfVar13 != local_78);
      }
      local_bc = local_bc + -1;
      local_a0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_80 + 1;
    } while (local_a0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_88);
  }
  pPVar12 = (this->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->barcode_).
           super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar12 != pPVar4) {
    uVar11 = ((long)pPVar4 - (long)pPVar12 >> 2) * -0x5555555555555555;
    lVar18 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar12,pPVar4,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar12,pPVar4);
  }
  local_c4 = 0.0;
  pPVar12 = (this->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->barcode_).
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar12) {
    uVar11 = 0;
    do {
      local_c0 = (float)pPVar12[uVar11].death;
      if (local_c0 != -NAN) {
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->deathToBar_,&local_c0,&local_c4);
      }
      local_c4 = (float)((int)local_c4 + 1);
      uVar11 = (ulong)(uint)local_c4;
      pPVar12 = (this->barcode_).
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = ((long)(this->barcode_).
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12 >> 2) *
               -0x5555555555555555;
    } while (uVar11 <= uVar15 && uVar15 - uVar11 != 0);
  }
  this->isReduced_ = true;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_a0);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_reduce() 
{
  constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();
  constexpr const Index nullIndex = Master_matrix::template get_null_value<Index>();

  std::unordered_map<Index, Index> negativeColumns(_matrix()->get_number_of_columns());

  auto dim = _matrix()->get_max_dimension();
  std::vector<std::vector<Index> > columnsByDim(dim + 1);
  for (auto& v : columnsByDim) v.reserve(_matrix()->get_number_of_columns());
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    columnsByDim[dim - _matrix()->get_column_dimension(i)].push_back(i);
  }

  for (const auto& cols : columnsByDim) {
    for (Index i : cols) {
      auto& curr = _matrix()->get_column(i);
      if (curr.is_empty()) {
        if (negativeColumns.find(i) == negativeColumns.end()) {
          barcode_.emplace_back(i, nullDeath, dim);
        }
      } else {
        ID_index pivot = curr.get_pivot();
        auto it = idToPosition_.find(pivot);
        Index pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
        auto itNeg = negativeColumns.find(pivotColumnNumber);
        Index pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;

        while (pivot != Master_matrix::template get_null_value<ID_index>() &&
               pivotKiller != Master_matrix::template get_null_value<Index>()) {
          if constexpr (Master_matrix::Option_list::is_z2) {
            curr += _matrix()->get_column(pivotKiller);
          } else {
            auto& toadd = _matrix()->get_column(pivotKiller);
            typename Master_matrix::Element coef = toadd.get_pivot_value();
            auto& operators = _matrix()->colSettings_->operators;
            coef = operators.get_inverse(coef);
            operators.multiply_inplace(coef, operators.get_characteristic() - curr.get_pivot_value());
            curr.multiply_source_and_add(toadd, coef);
          }

          pivot = curr.get_pivot();
          it = idToPosition_.find(pivot);
          pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
          itNeg = negativeColumns.find(pivotColumnNumber);
          pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;
        }

        if (pivot != Master_matrix::template get_null_value<ID_index>()) {
          negativeColumns.emplace(pivotColumnNumber, i);
          _matrix()->get_column(pivotColumnNumber).clear();
          barcode_.emplace_back(pivotColumnNumber, i, dim - 1);
        } else {
          curr.clear();
          barcode_.emplace_back(i, nullDeath, dim);
        }
      }
    }
    --dim;
  }

  if constexpr (Master_matrix::Option_list::has_removable_columns) {
    // sort barcode by birth such that a removal is trivial
    std::sort(barcode_.begin(), barcode_.end(), [](const Bar& b1, const Bar& b2) { return b1.birth < b2.birth; });
    // map can only be constructed once barcode is sorted
    for (Index i = 0; i < barcode_.size(); ++i) {
      auto d = barcode_[i].death;
      if (d != Master_matrix::template get_null_value<Pos_index>()) {
        deathToBar_.emplace(d, i);
      }
    }
  }

  isReduced_ = true;
}